

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_expressions.cpp
# Opt level: O2

PropertyExprSyntax * __thiscall slang::parsing::Parser::parseCasePropertyExpr(Parser *this)

{
  bool bVar1;
  int iVar2;
  ExpressionSyntax *expr;
  SourceLocation SVar3;
  ExpressionSyntax *pEVar4;
  Info *pIVar5;
  DefaultPropertyCaseItemSyntax *pDVar6;
  PropertyExprSyntax *pPVar7;
  undefined4 extraout_var;
  StandardPropertyCaseItemSyntax *pSVar8;
  Diagnostic *pDVar9;
  undefined4 extraout_var_00;
  CasePropertyExprSyntax *pCVar10;
  Token *ctx;
  EVP_PKEY_CTX *ctx_00;
  TokenKind TVar11;
  Token openParen;
  Token TVar12;
  Token TVar13;
  Token TVar14;
  string_view arg;
  string_view arg_00;
  Token local_240;
  SourceLocation local_230;
  SyntaxFactory *local_228;
  Token local_220;
  ulong local_210;
  Token keyword;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_1c0;
  ulong local_1b0;
  undefined8 uStack_1a8;
  undefined8 local_198;
  Token local_188;
  Token local_178;
  Token local_168;
  Token local_158;
  SmallVector<slang::syntax::PropertyCaseItemSyntax_*,_5UL> itemBuffer;
  SmallVector<slang::syntax::TokenOrSyntax,_8UL> buffer;
  
  keyword = ParserBase::consume(&this->super_ParserBase);
  openParen = ParserBase::expect(&this->super_ParserBase,OpenParenthesis);
  local_230 = (SourceLocation)0x0;
  expr = parseExpressionOrDist(this,(bitmask<slang::parsing::detail::ExpressionOptions>)0x0);
  TVar12 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
  pIVar5 = (Info *)itemBuffer.super_SmallVectorBase<slang::syntax::PropertyCaseItemSyntax_*>.
                   firstElement;
  itemBuffer.super_SmallVectorBase<slang::syntax::PropertyCaseItemSyntax_*>.len = 0;
  itemBuffer.super_SmallVectorBase<slang::syntax::PropertyCaseItemSyntax_*>.cap = 5;
  local_228 = &this->factory;
  local_210 = 0;
  itemBuffer.super_SmallVectorBase<slang::syntax::PropertyCaseItemSyntax_*>.data_ = (pointer)pIVar5;
  do {
    while( true ) {
      TVar13 = ParserBase::peek(&this->super_ParserBase);
      if (TVar13.kind != DefaultKeyword) break;
      if (((ulong)local_230 & 0xfffffff) != 0 && (local_210 & 1) == 0) {
        buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>._0_16_ =
             ParserBase::peek(&this->super_ParserBase);
        SVar3 = Token::location((Token *)&buffer);
        pDVar9 = ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x7f0005,SVar3);
        arg._M_str = "case";
        arg._M_len = 4;
        pDVar9 = Diagnostic::operator<<(pDVar9,arg);
        local_210 = CONCAT71((int7)((ulong)pIVar5 >> 8),1);
        Diagnostic::addNote(pDVar9,(DiagCode)0xa0001,local_230);
      }
      buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>._0_16_ =
           ParserBase::peek(&this->super_ParserBase);
      local_230 = Token::location((Token *)&buffer);
      TVar13 = ParserBase::consume(&this->super_ParserBase);
      TVar14 = ParserBase::consumeIf(&this->super_ParserBase,Colon);
      pIVar5 = TVar14._0_8_;
      pPVar7 = parsePropertyExpr(this,0);
      local_158 = ParserBase::expect(&this->super_ParserBase,Semicolon);
      pDVar6 = slang::syntax::SyntaxFactory::defaultPropertyCaseItem
                         (local_228,TVar13,TVar14,pPVar7,local_158);
      buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.data_ = (pointer)pDVar6;
      SmallVectorBase<slang::syntax::PropertyCaseItemSyntax*>::
      emplace_back<slang::syntax::PropertyCaseItemSyntax*>
                ((SmallVectorBase<slang::syntax::PropertyCaseItemSyntax*> *)&itemBuffer,
                 (PropertyCaseItemSyntax **)&buffer);
    }
    bVar1 = slang::syntax::SyntaxFacts::isPossibleExpression(TVar13.kind);
    if (!bVar1) {
      if (itemBuffer.super_SmallVectorBase<slang::syntax::PropertyCaseItemSyntax_*>.len == 0) {
        SVar3 = Token::location(&keyword);
        pDVar9 = ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x50005,SVar3);
        arg_00._M_str = "case";
        arg_00._M_len = 4;
        Diagnostic::operator<<(pDVar9,arg_00);
      }
      TVar14 = ParserBase::expect(&this->super_ParserBase,EndCaseKeyword);
      TVar13 = keyword;
      ctx_00 = (EVP_PKEY_CTX *)keyword._0_8_;
      local_178 = TVar12;
      buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement._16_4_ =
           SmallVectorBase<slang::syntax::PropertyCaseItemSyntax_*>::copy
                     (&itemBuffer.super_SmallVectorBase<slang::syntax::PropertyCaseItemSyntax_*>,
                      (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,(EVP_PKEY_CTX *)TVar14.info);
      buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement._20_4_ =
           extraout_var_00;
      buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.len._0_4_ = 1;
      buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.cap = 0;
      buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[0] = '\0';
      buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[1] = '\0';
      buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[2] = '\0';
      buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[3] = '\0';
      buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[4] = '\0';
      buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[5] = '\0';
      buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[6] = '\0';
      buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[7] = '\0';
      buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.data_ =
           (pointer)&PTR_getChild_006a3788;
      local_188 = TVar14;
      pCVar10 = slang::syntax::SyntaxFactory::casePropertyExpr
                          (local_228,TVar13,openParen,expr,local_178,
                           (SyntaxList<slang::syntax::PropertyCaseItemSyntax> *)&buffer,TVar14);
      SmallVectorBase<slang::syntax::PropertyCaseItemSyntax_*>::cleanup
                (&itemBuffer.super_SmallVectorBase<slang::syntax::PropertyCaseItemSyntax_*>,ctx_00);
      return &pCVar10->super_PropertyExprSyntax;
    }
    Token::Token(&local_220);
    buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.len = 0;
    buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.data_ =
         (pointer)buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement;
    buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.cap = 8;
    local_240 = ParserBase::peek(&this->super_ParserBase);
    bVar1 = slang::syntax::SyntaxFacts::isEndOfCaseItem(local_240.kind);
    if (bVar1) {
      bVar1 = ParserBase::haveDiagAtCurrentLoc(&this->super_ParserBase);
      if (!bVar1) {
        SVar3 = Token::location(&local_240);
        ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x10001,SVar3);
      }
      local_220 = ParserBase::expect(&this->super_ParserBase,Colon);
    }
    else {
      bVar1 = slang::syntax::SyntaxFacts::isPossibleExpressionOrComma(local_240.kind);
      TVar13 = local_240;
      if (bVar1) {
        do {
          local_240 = TVar13;
          pEVar4 = parseExpressionOrDist
                             (this,(bitmask<slang::parsing::detail::ExpressionOptions>)0x0);
          local_1c0._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pEVar4;
          local_1b0 = CONCAT71(local_1b0._1_7_,1);
          SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                    (&buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
                     (TokenOrSyntax *)&local_1c0._M_first);
          TVar13 = ParserBase::peek(&this->super_ParserBase);
          TVar11 = TVar13.kind;
          bVar1 = slang::syntax::SyntaxFacts::isEndOfCaseItem(TVar11);
          if (TVar11 == EndOfFile || bVar1) break;
          if (TVar11 != Comma) {
            ParserBase::expect(&this->super_ParserBase,Comma);
            do {
              bVar1 = ParserBase::
                      skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleExpressionOrComma,&slang::syntax::SyntaxFacts::isEndOfCaseItem>
                                (&this->super_ParserBase,(DiagCode)0x10001,false);
              if (!bVar1) {
                local_220 = ParserBase::expect(&this->super_ParserBase,Colon);
                goto LAB_002a6333;
              }
              bVar1 = ParserBase::peek(&this->super_ParserBase,Comma);
            } while (!bVar1);
          }
          local_1c0._M_first._M_storage =
               (_Uninitialized<slang::parsing::Token,_true>)
               ParserBase::expect(&this->super_ParserBase,Comma);
          local_1b0 = local_1b0 & 0xffffffffffffff00;
          SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                    (&buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
                     (TokenOrSyntax *)&local_1c0._M_first);
          TVar13 = ParserBase::peek(&this->super_ParserBase);
          TVar11 = TVar13.kind;
          bVar1 = slang::syntax::SyntaxFacts::isEndOfCaseItem(TVar11);
          if (TVar11 == EndOfFile || bVar1) {
            ParserBase::reportMisplacedSeparator(&this->super_ParserBase);
            break;
          }
        } while (((local_240.kind != TVar11) || (local_240.info != TVar13.info)) ||
                (bVar1 = ParserBase::
                         skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleExpressionOrComma,&slang::syntax::SyntaxFacts::isEndOfCaseItem>
                                   (&this->super_ParserBase,(DiagCode)0x10001,true), bVar1));
        local_220 = ParserBase::expect(&this->super_ParserBase,Colon);
      }
      else {
        ParserBase::reportMissingList
                  (&this->super_ParserBase,local_240,Colon,&local_220,(DiagCode)0x10001);
      }
    }
LAB_002a6333:
    pPVar7 = parsePropertyExpr(this,0);
    TVar13 = ParserBase::expect(&this->super_ParserBase,Semicolon);
    iVar2 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                      (&buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
                       (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,(EVP_PKEY_CTX *)TVar13.info);
    local_198 = CONCAT44(extraout_var,iVar2);
    local_1c0._8_4_ = 3;
    local_1b0 = 0;
    uStack_1a8 = 0;
    local_1c0._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)&PTR_getChild_006a38f0;
    pIVar5 = local_220.info;
    local_168 = TVar13;
    pSVar8 = slang::syntax::SyntaxFactory::standardPropertyCaseItem
                       (local_228,
                        (SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)&local_1c0._M_first,
                        local_220,pPVar7,TVar13);
    local_240._0_8_ = pSVar8;
    ctx = &local_240;
    SmallVectorBase<slang::syntax::PropertyCaseItemSyntax*>::
    emplace_back<slang::syntax::PropertyCaseItemSyntax*>
              ((SmallVectorBase<slang::syntax::PropertyCaseItemSyntax*> *)&itemBuffer,
               (PropertyCaseItemSyntax **)ctx);
    SmallVectorBase<slang::syntax::TokenOrSyntax>::cleanup
              (&buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,(EVP_PKEY_CTX *)ctx);
  } while( true );
}

Assistant:

PropertyExprSyntax& Parser::parseCasePropertyExpr() {
    auto keyword = consume();
    auto openParen = expect(TokenKind::OpenParenthesis);
    auto& condition = parseExpressionOrDist();
    auto closeParen = expect(TokenKind::CloseParenthesis);

    SmallVector<PropertyCaseItemSyntax*> itemBuffer;
    SourceLocation lastDefault;
    bool errored = false;

    while (true) {
        auto kind = peek().kind;
        if (kind == TokenKind::DefaultKeyword) {
            if (lastDefault && !errored) {
                auto& diag = addDiag(diag::MultipleDefaultCases, peek().location()) << "case"sv;
                diag.addNote(diag::NotePreviousDefinition, lastDefault);
                errored = true;
            }

            lastDefault = peek().location();

            auto def = consume();
            auto colon = consumeIf(TokenKind::Colon);
            auto& expr = parsePropertyExpr(0);
            auto semi = expect(TokenKind::Semicolon);
            itemBuffer.push_back(&factory.defaultPropertyCaseItem(def, colon, expr, semi));
        }
        else if (isPossibleExpression(kind)) {
            Token colon;
            SmallVector<TokenOrSyntax, 8> buffer;
            parseList<isPossibleExpressionOrComma, isEndOfCaseItem>(
                buffer, TokenKind::Colon, TokenKind::Comma, colon, RequireItems::True,
                diag::ExpectedExpression, [this] { return &parseExpressionOrDist(); });

            auto& expr = parsePropertyExpr(0);
            auto semi = expect(TokenKind::Semicolon);
            itemBuffer.push_back(
                &factory.standardPropertyCaseItem(buffer.copy(alloc), colon, expr, semi));
        }
        else {
            break;
        }
    }

    if (itemBuffer.empty())
        addDiag(diag::CaseStatementEmpty, keyword.location()) << "case"sv;

    auto endcase = expect(TokenKind::EndCaseKeyword);
    return factory.casePropertyExpr(keyword, openParen, condition, closeParen,
                                    itemBuffer.copy(alloc), endcase);
}